

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

int Wlc_ObjAlloc(Wlc_Ntk_t *p,int Type,int Signed,int End,int Beg)

{
  Wlc_Obj_t *pWVar1;
  int iVar2;
  int iVar3;
  
  if ((Type != 4) && (Type != 2)) {
    iVar3 = p->iObj;
    if (iVar3 == p->nObjsAlloc) {
      if (p->pObjs == (Wlc_Obj_t *)0x0) {
        pWVar1 = (Wlc_Obj_t *)malloc((long)iVar3 * 0x30);
        iVar2 = iVar3;
      }
      else {
        pWVar1 = (Wlc_Obj_t *)realloc(p->pObjs,(long)iVar3 * 0x30);
        iVar3 = p->iObj;
        iVar2 = p->nObjsAlloc;
      }
      p->pObjs = pWVar1;
      memset(pWVar1 + iVar2,0,(long)iVar2 * 0x18);
      p->nObjsAlloc = iVar2 * 2;
    }
    pWVar1 = Wlc_NtkObj(p,iVar3);
    *(ushort *)pWVar1 =
         (ushort)((Signed & 1U) << 6) | (ushort)Type & 0x3f | (ushort)*(undefined4 *)pWVar1 & 0xff80
    ;
    pWVar1->End = End;
    pWVar1->Beg = Beg;
    if (((ushort)Type & 0x3d) == 1) {
      Wlc_ObjSetCi(p,pWVar1);
    }
    p->nObjs[Type] = p->nObjs[Type] + 1;
    iVar3 = p->iObj;
    p->iObj = iVar3 + 1;
    return iVar3;
  }
  __assert_fail("Type != WLC_OBJ_PO && Type != WLC_OBJ_FI",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNtk.c"
                ,0xc9,"int Wlc_ObjAlloc(Wlc_Ntk_t *, int, int, int, int)");
}

Assistant:

int Wlc_ObjAlloc( Wlc_Ntk_t * p, int Type, int Signed, int End, int Beg )
{
    Wlc_Obj_t * pObj;
    assert( Type != WLC_OBJ_PO && Type != WLC_OBJ_FI );
    if ( p->iObj == p->nObjsAlloc )
    {
        p->pObjs = ABC_REALLOC( Wlc_Obj_t, p->pObjs, 2 * p->nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Wlc_Obj_t) * p->nObjsAlloc );
        p->nObjsAlloc *= 2;
    }
    pObj = Wlc_NtkObj( p, p->iObj );
    pObj->Type   = Type;
    pObj->Signed = Signed;
    pObj->End    = End;
    pObj->Beg    = Beg;
    if ( Wlc_ObjIsCi(pObj) )
        Wlc_ObjSetCi( p, pObj );
    p->nObjs[Type]++;
    return p->iObj++;
}